

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heterogeneous_queue_basic_tests.cpp
# Opt level: O2

void density_tests::lf_heterogeneous_queue_basic_tests(ostream *i_ostream)

{
  PrintScopeDuration dur;
  PrintScopeDuration PStack_38;
  
  PrintScopeDuration::PrintScopeDuration
            (&PStack_38,i_ostream,"lock-free heterogeneous queue basic tests");
  NbQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::tests(i_ostream);
  NbQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::tests(i_ostream);
  NbQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::tests(i_ostream);
  NbQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
  ::tests(i_ostream);
  NbQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::tests(i_ostream);
  NbQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::tests(i_ostream);
  NbQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::tests(i_ostream);
  NbQueueBasicTests<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::tests(i_ostream);
  PrintScopeDuration::~PrintScopeDuration(&PStack_38);
  return;
}

Assistant:

void lf_heterogeneous_queue_basic_tests(std::ostream & i_ostream)
    {
        PrintScopeDuration dur(i_ostream, "lock-free heterogeneous queue basic tests");

        constexpr auto mult    = density::concurrency_multiple;
        constexpr auto single  = density::concurrency_single;
        constexpr auto seq_cst = density::consistency_sequential;
        constexpr auto relaxed = density::consistency_relaxed;

        NbQueueBasicTests<mult, mult, seq_cst>::tests(i_ostream);
        NbQueueBasicTests<single, mult, seq_cst>::tests(i_ostream);
        NbQueueBasicTests<mult, single, seq_cst>::tests(i_ostream);
        NbQueueBasicTests<single, single, seq_cst>::tests(i_ostream);

        NbQueueBasicTests<mult, mult, relaxed>::tests(i_ostream);
        NbQueueBasicTests<single, mult, relaxed>::tests(i_ostream);
        NbQueueBasicTests<mult, single, relaxed>::tests(i_ostream);
        NbQueueBasicTests<single, single, relaxed>::tests(i_ostream);
    }